

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O2

ExceptionOr<kj::Array<unsigned_char>_> * __thiscall
kj::_::ExceptionOr<kj::Array<unsigned_char>_>::operator=
          (ExceptionOr<kj::Array<unsigned_char>_> *this,
          ExceptionOr<kj::Array<unsigned_char>_> *param_1)

{
  Maybe<kj::Exception>::operator=((Maybe<kj::Exception> *)this,(Maybe<kj::Exception> *)param_1);
  Maybe<kj::Array<unsigned_char>_>::operator=(&this->value,&param_1->value);
  return this;
}

Assistant:

ExceptionOr& operator=(ExceptionOr&&) = default;